

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpiAnalyzer.cpp
# Opt level: O0

void __thiscall SpiAnalyzer::GetWord(SpiAnalyzer *this)

{
  MarkerType MVar1;
  value_type vVar2;
  int iVar3;
  ulonglong uVar4;
  bool bVar5;
  element_type *peVar6;
  U64 UVar7;
  size_type sVar8;
  element_type *peVar9;
  reference pvVar10;
  FrameV2 local_b0 [8];
  FrameV2 frame_v2_end_of_transaction;
  uint local_a4;
  U32 bit_offset;
  int i_2;
  U8 miso_bytearray [8];
  U8 mosi_bytearray [8];
  FrameV2 framev2;
  ulonglong local_78;
  Frame result_frame;
  uint local_4c;
  U32 i_1;
  U32 count;
  U32 i;
  U64 disable_event_sample;
  ulonglong uStack_30;
  bool need_reset;
  U64 first_sample;
  U64 miso_word;
  U64 mosi_word;
  U32 bytes_per_transfer;
  U32 bits_per_transfer;
  SpiAnalyzer *this_local;
  
  _bytes_per_transfer = this;
  peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
  mosi_word._4_4_ = peVar6->mBitsPerTransfer;
  mosi_word._0_4_ = mosi_word._4_4_ + 7 >> 3;
  miso_word = 0;
  peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
  DataBuilder::Reset((ulonglong *)&this->mMosiResult,(ShiftOrder)&miso_word,peVar6->mShiftOrder);
  first_sample = 0;
  peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
  DataBuilder::Reset((ulonglong *)&this->mMisoResult,(ShiftOrder)&first_sample,peVar6->mShiftOrder);
  uStack_30 = 0;
  disable_event_sample._7_1_ = 0;
  _count = 0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::clear
            (&this->mArrowLocations);
  AnalyzerChannelData::GetSampleNumber();
  Analyzer::ReportProgress((ulonglong)this);
  i_1 = 0;
  do {
    if (mosi_word._4_4_ <= i_1) {
LAB_00109eda:
      sVar8 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                        (&this->mArrowLocations);
      for (local_4c = 0; local_4c < (uint)sVar8; local_4c = local_4c + 1) {
        peVar9 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
        pvVar10 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                            (&this->mArrowLocations,(ulong)local_4c);
        vVar2 = *pvVar10;
        MVar1 = this->mArrowMarker;
        std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
        AnalyzerResults::AddMarker((ulonglong)peVar9,(MarkerType)vVar2,(Channel *)(ulong)MVar1);
      }
      Frame::Frame((Frame *)&local_78);
      local_78 = uStack_30;
      _result_frame = AnalyzerChannelData::GetSampleNumber();
      peVar9 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::AddFrame((Frame *)peVar9);
      FrameV2::FrameV2((FrameV2 *)mosi_bytearray);
      for (local_a4 = 0; local_a4 < (uint)mosi_word; local_a4 = local_a4 + 1) {
        _frame_v2_end_of_transaction = (((uint)mosi_word - local_a4) + -1) * 8;
        miso_bytearray[(int)local_a4] =
             (U8)(miso_word >> ((byte)_frame_v2_end_of_transaction & 0x3f));
        *(char *)((long)&bit_offset + (long)(int)local_a4) =
             (char)(first_sample >> ((byte)_frame_v2_end_of_transaction & 0x3f));
      }
      FrameV2::AddByteArray((char *)mosi_bytearray,(uchar *)"mosi",(ulonglong)miso_bytearray);
      FrameV2::AddByteArray((char *)mosi_bytearray,(uchar *)"miso",(ulonglong)&bit_offset);
      peVar9 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      uVar4 = uStack_30;
      AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddFrameV2((FrameV2 *)peVar9,(char *)mosi_bytearray,0x110017,uVar4);
      std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
      AnalyzerResults::CommitResults();
      if ((disable_event_sample._7_1_ & 1) == 1) {
        FrameV2::FrameV2(local_b0);
        peVar9 = std::auto_ptr<SpiAnalyzerResults>::operator->(&this->mResults);
        AnalyzerResults::AddFrameV2((FrameV2 *)peVar9,(char *)local_b0,0x11001e,_count);
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
        FrameV2::~FrameV2(local_b0);
      }
      FrameV2::~FrameV2((FrameV2 *)mosi_bytearray);
      Frame::~Frame((Frame *)&local_78);
      return;
    }
    if (i_1 == 0) {
      Analyzer::CheckIfThreadShouldExit();
    }
    bVar5 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
    if (bVar5) {
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      return;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    if (i_1 == 0) {
      uStack_30 = AnalyzerChannelData::GetSampleNumber();
    }
    peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
    iVar3 = (int)this;
    if (peVar6->mDataValidEdge == LeadingEdge) {
      UVar7 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar7;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(iVar3 + 0xb8);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(iVar3 + 0xc0);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
    if ((i_1 == mosi_word._4_4_ - 1) &&
       (peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings),
       peVar6->mDataValidEdge != TrailingEdge)) {
      bVar5 = WouldAdvancingTheClockToggleEnable(this,false,(U64 *)&count);
      if (bVar5) {
        disable_event_sample._7_1_ = 1;
      }
      else {
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      goto LAB_00109eda;
    }
    bVar5 = WouldAdvancingTheClockToggleEnable(this,true,(U64 *)0x0);
    if (bVar5) {
      AdvanceToActiveEnableEdgeWithCorrectClockPolarity(this);
      return;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    peVar6 = std::auto_ptr<SpiAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar6->mDataValidEdge == TrailingEdge) {
      UVar7 = AnalyzerChannelData::GetSampleNumber();
      this->mCurrentSample = UVar7;
      if (this->mMosi != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMosi);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(iVar3 + 0xb8);
      }
      if (this->mMiso != (AnalyzerChannelData *)0x0) {
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mMiso);
        AnalyzerChannelData::GetBitState();
        DataBuilder::AddBit(iVar3 + 0xc0);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (&this->mArrowLocations,&this->mCurrentSample);
    }
    i_1 = i_1 + 1;
  } while( true );
}

Assistant:

void SpiAnalyzer::GetWord()
{
    // we're assuming we come into this function with the clock in the idle state;

    const U32 bits_per_transfer = mSettings->mBitsPerTransfer;
    const U32 bytes_per_transfer = ( bits_per_transfer + 7 ) / 8;

    U64 mosi_word = 0;
    mMosiResult.Reset( &mosi_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 miso_word = 0;
    mMisoResult.Reset( &miso_word, mSettings->mShiftOrder, bits_per_transfer );

    U64 first_sample = 0;
    bool need_reset = false;
    U64 disable_event_sample = 0;


    mArrowLocations.clear();
    ReportProgress( mClock->GetSampleNumber() );

    for( U32 i = 0; i < bits_per_transfer; i++ )
    {
        if( i == 0 )
            CheckIfThreadShouldExit();

        // on every single edge, we need to check that enable doesn't toggle.
        // note that we can't just advance the enable line to the next edge, becuase there may not be another edge

        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();
        if( i == 0 )
            first_sample = mClock->GetSampleNumber();

        if( mSettings->mDataValidEdge == AnalyzerEnums::LeadingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }


        // ok, the trailing edge is messy -- but only on the very last bit.
        // If the trialing edge isn't doesn't represent valid data, we want to allow the enable line to rise before the clock trialing edge
        // -- and still report the frame
        if( ( i == ( bits_per_transfer - 1 ) ) && ( mSettings->mDataValidEdge != AnalyzerEnums::TrailingEdge ) )
        {
            // if this is the last bit, and the trailing edge doesn't represent valid data
            if( WouldAdvancingTheClockToggleEnable( false, &disable_event_sample ) == true )
            {
                // moving to the trailing edge would cause the clock to revert to inactive.  jump out, record the frame, and them move to
                // the next active enable edge
                need_reset = true;
                break;
            }

            // enable isn't going to go inactive, go ahead and advance the clock as usual.  Then we're done, jump out and record the frame.
            mClock->AdvanceToNextEdge();
            break;
        }

        // this isn't the very last bit, etc, so proceed as normal
        if( WouldAdvancingTheClockToggleEnable( true, nullptr ) == true )
        {
            AdvanceToActiveEnableEdgeWithCorrectClockPolarity(); // ok, we pretty much need to reset everything and return.
            return;
        }

        mClock->AdvanceToNextEdge();

        if( mSettings->mDataValidEdge == AnalyzerEnums::TrailingEdge )
        {
            mCurrentSample = mClock->GetSampleNumber();
            if( mMosi != NULL )
            {
                mMosi->AdvanceToAbsPosition( mCurrentSample );
                mMosiResult.AddBit( mMosi->GetBitState() );
            }
            if( mMiso != NULL )
            {
                mMiso->AdvanceToAbsPosition( mCurrentSample );
                mMisoResult.AddBit( mMiso->GetBitState() );
            }
            mArrowLocations.push_back( mCurrentSample );
        }
    }

    // save the results:
    U32 count = mArrowLocations.size();
    for( U32 i = 0; i < count; i++ )
        mResults->AddMarker( mArrowLocations[ i ], mArrowMarker, mSettings->mClockChannel );

    Frame result_frame;
    result_frame.mStartingSampleInclusive = first_sample;
    result_frame.mEndingSampleInclusive = mClock->GetSampleNumber();
    result_frame.mData1 = mosi_word;
    result_frame.mData2 = miso_word;
    result_frame.mFlags = 0;
    mResults->AddFrame( result_frame );

    FrameV2 framev2;

    // Max bits per transfer == 64, max bytes == 8
    U8 mosi_bytearray[ 8 ];
    U8 miso_bytearray[ 8 ];
    for( int i = 0; i < bytes_per_transfer; ++i )
    {
        auto bit_offset = ( bytes_per_transfer - i - 1 ) * 8;
        mosi_bytearray[ i ] = mosi_word >> bit_offset;
        miso_bytearray[ i ] = miso_word >> bit_offset;
    }
    framev2.AddByteArray( "mosi", mosi_bytearray, bytes_per_transfer );
    framev2.AddByteArray( "miso", miso_bytearray, bytes_per_transfer );

    mResults->AddFrameV2( framev2, "result", first_sample, mClock->GetSampleNumber() + 1 );

    mResults->CommitResults();

    if( need_reset == true )
    {
        FrameV2 frame_v2_end_of_transaction;
        mResults->AddFrameV2( frame_v2_end_of_transaction, "disable", disable_event_sample, disable_event_sample + 1 );
        AdvanceToActiveEnableEdgeWithCorrectClockPolarity();
    }
}